

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O0

_Bool Curl_uint_spbset_empty(uint_spbset *bset)

{
  uint local_24;
  uint_spbset_chunk *puStack_20;
  uint i;
  uint_spbset_chunk *chunk;
  uint_spbset *bset_local;
  
  puStack_20 = &bset->head;
  do {
    if (puStack_20 == (uint_spbset_chunk *)0x0) {
      return true;
    }
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      if (puStack_20->slots[local_24] != 0) {
        return false;
      }
    }
    puStack_20 = ((uint_spbset_chunk *)&puStack_20->next)->next;
  } while( true );
}

Assistant:

bool Curl_uint_spbset_empty(struct uint_spbset *bset)
{
  struct uint_spbset_chunk *chunk;
  unsigned int i;

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    for(i = 0; i < CURL_UINT_SPBSET_CH_SLOTS; ++i) {
      if(chunk->slots[i])
        return FALSE;
    }
  }
  return TRUE;
}